

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckArrayEqualTrue::RunImpl(TestCheckArrayEqualTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int array [3];
  TestResults results;
  int local_68 [2];
  TestDetails local_60;
  int local_40 [4];
  TestResults local_30;
  
  UnitTest::TestResults::TestResults(&local_30,(TestReporter *)0x0);
  local_40[0] = 1;
  local_40[1] = 2;
  local_40[2] = 3;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckArrayEqual<int[3],int[3]>
            (&local_30,(int (*) [3])local_40,(int (*) [3])local_40,3,&local_60);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68[1] = 0;
  local_68[0] = UnitTest::TestResults::GetFailureCount(&local_30);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0xbe);
  UnitTest::CheckEqual<int,int>(results_00,local_68 + 1,local_68,&local_60);
  return;
}

Assistant:

TEST(CheckArrayEqualTrue)
{
    TestResults results;

    int const array[3] = { 1, 2, 3 };
    CheckArrayEqual(results, array, array, 3, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}